

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_false,_false>::rebuild(DaTrie<false,_false,_false> *this)

{
  long in_RDI;
  uint32_t bc_capa;
  DaTrie<false,_false,_false> new_trie;
  DaTrie<false,_false,_false> *in_stack_00000128;
  DaTrie<false,_false,_false> *in_stack_00000130;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffff58;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffff60;
  DaTrie<false,_false,_false> *this_00;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  DaTrie(in_stack_ffffffffffffff60);
  num_nodes(in_stack_ffffffffffffff60);
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::reserve
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  this_00 = (DaTrie<false,_false,_false> *)&stack0xffffffffffffffa0;
  std::vector<char,_std::allocator<char>_>::size
            ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x18));
  std::vector<char,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::reserve
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  rebuild_(in_stack_00000130,in_stack_00000128);
  swap(this_00,in_stack_ffffffffffffff58);
  ~DaTrie(this_00);
  return;
}

Assistant:

void rebuild() {
    assert(!Prefix);

    DaTrie new_trie;

    const auto bc_capa = num_nodes() / 256 * 256 + 1024; // expecting avoidance of reallocation
    new_trie.bc_.reserve(bc_capa);
    new_trie.tail_.reserve(tail_.size() - tail_emps_);
    new_trie.blocks_.reserve(bc_capa / 256);
    if (WithNLM) {
      new_trie.node_links_.reserve(bc_capa);
    }

    rebuild_(new_trie);
    swap(new_trie);
  }